

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O3

double inform_shannon_cross(inform_dist *p,inform_dist *q,double base)

{
  uint64_t uVar1;
  uint uVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double local_30;
  
  _Var3 = inform_dist_is_valid(p);
  local_30 = NAN;
  if (_Var3) {
    _Var3 = inform_dist_is_valid(q);
    if (_Var3) {
      uVar4 = p->size;
      local_30 = NAN;
      if (uVar4 == q->size) {
        if (uVar4 == 0) {
          local_30 = 0.0;
        }
        else {
          local_30 = 0.0;
          uVar5 = 0;
          do {
            uVar2 = p->histogram[uVar5];
            if (uVar2 != 0 || q->histogram[uVar5] != 0) {
              uVar1 = p->counts;
              dVar6 = log2((double)q->histogram[uVar5] /
                           (((double)CONCAT44(0x45300000,(int)(q->counts >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)q->counts) - 4503599627370496.0)));
              local_30 = local_30 -
                         dVar6 * ((double)uVar2 /
                                 (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
              uVar4 = p->size;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < uVar4);
        }
        dVar6 = log2(base);
        local_30 = local_30 / dVar6;
      }
    }
    else {
      local_30 = NAN;
    }
  }
  return local_30;
}

Assistant:

double inform_shannon_cross(inform_dist const *p, inform_dist const *q,
    double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double ce = 0.;
        for (size_t i = 0; i < p->size; ++i)
        {
            if (p->histogram[i] != 0 || q->histogram[i] != 0)
            {
                double u = (double) p->histogram[i] / p->counts;
                double v = (double) q->histogram[i] / q->counts;
                ce -= u * log2(v);
            }
        }
        return ce / log2(base);
    }
    return NAN;
}